

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poller.cpp
# Opt level: O0

void __thiscall Liby::Poller::Poller(Poller *this)

{
  size_type __n;
  allocator<Liby::Channel_*> local_19;
  value_type local_18;
  Poller *local_10;
  Poller *this_local;
  
  this->_vptr_Poller = (_func_int **)&PTR__Poller_0018d410;
  local_10 = this;
  __n = get_open_max();
  local_18 = (value_type)0x0;
  std::allocator<Liby::Channel_*>::allocator(&local_19);
  std::vector<Liby::Channel_*,_std::allocator<Liby::Channel_*>_>::vector
            (&this->channels_,__n,&local_18,&local_19);
  std::allocator<Liby::Channel_*>::~allocator(&local_19);
  std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::list
            (&this->nextTickHandlers_);
  std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::list
            (&this->nextLoopHandlers_);
  std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::list
            (&this->afterLoopHandlers_);
  return;
}

Assistant:

Poller::Poller() : channels_(get_open_max(), nullptr) {}